

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O2

Ref __thiscall trun::TestRunner::CreateTestFunc(TestRunner *this,string *symbol)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long lVar2;
  ILogger *pIVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar4;
  Ref RVar5;
  allocator<char> local_a9;
  Ref func;
  string testCase;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  funcparts;
  string local_60;
  element_type *local_40;
  string *local_38;
  
  func.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  func.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  funcparts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  funcparts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  funcparts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  split(&funcparts,(symbol->_M_dataplus)._M_p,0x5f);
  lVar2 = (long)funcparts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)funcparts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (lVar2 == 3) {
    TestFunc::Create(&testCase,symbol,
                     funcparts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
    std::__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&func.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)&testCase);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&testCase._M_string_length);
  }
  else if (lVar2 == 2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&testCase,"-",&local_a9);
    TestFunc::Create(&local_60,symbol,&testCase);
    std::__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&func.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_string_length);
    std::__cxx11::string::~string((string *)&testCase);
  }
  else {
    if (lVar2 == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&testCase,"TestRunner",(allocator<char> *)&local_60);
      pIVar3 = gnilk::Logger::GetLogger(&testCase);
      (*pIVar3->_vptr_ILogger[5])
                (pIVar3,
                 "Bare test function: \'%s\' (skipping), consider renaming: (test_<library>_<case>)"
                 ,(symbol->_M_dataplus)._M_p);
      std::__cxx11::string::~string((string *)&testCase);
      this->pLogger = (ILogger *)0x0;
      (this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      goto LAB_0010abef;
    }
    local_40 = (element_type *)this;
    local_38 = symbol;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testCase,"",(allocator<char> *)&local_60);
    lVar2 = 0x40;
    for (uVar4 = 2;
        uVar4 < (ulong)((long)funcparts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)funcparts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&testCase,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((funcparts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2));
      if (uVar4 < ((long)funcparts.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)funcparts.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"_",&local_a9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&testCase,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
      }
      lVar2 = lVar2 + 0x20;
    }
    TestFunc::Create(&local_60,local_38,
                     funcparts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
    std::__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&func.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_string_length);
    std::__cxx11::string::~string((string *)&testCase);
    this = (TestRunner *)local_40;
  }
  _Var1._M_pi = func.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  func.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((element_type *)this)->symbolName)._M_dataplus._M_p =
       (pointer)func.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (((Ref *)&(((element_type *)this)->symbolName)._M_string_length)->
  super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)_Var1._M_pi;
  func.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_0010abef:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&funcparts);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&func.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  RVar5.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar5.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ref)RVar5.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TestFunc::Ref TestRunner::CreateTestFunc(const std::string &symbol) {
    TestFunc::Ref func = nullptr;

    std::vector<std::string> funcparts;
    trun::split(funcparts, symbol.c_str(), '_');

    if (funcparts.size() == 1) {
        gnilk::Logger::GetLogger("TestRunner")->Warning("Bare test function: '%s' (skipping), consider renaming: (test_<library>_<case>)", symbol.c_str());
        return nullptr;
    } else if (funcparts.size() == 2) {
        func = TestFunc::Create(symbol,"-", funcparts[1]);
    } else if (funcparts.size() == 3) {
        func = TestFunc::Create(symbol, funcparts[1], funcparts[2]);
    } else {
        // merge '3' and onwards
        std::string testCase = "";
        for(size_t i=2;i<funcparts.size();i++) {
            testCase += funcparts[i];
            if (i<(funcparts.size()-1)) {
                testCase += std::string("_");
            }
        }
        func = TestFunc::Create(symbol, funcparts[1], testCase);
    }

    return func;
}